

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

Path * Path::resolved(Path *__return_storage_ptr__,String *path,ResolveMode mode,Path *cwd,bool *ok)

{
  bool bVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  bVar1 = resolve(__return_storage_ptr__,mode,cwd,(bool *)0x0);
  if (ok != (bool *)0x0) {
    *ok = ok != (bool *)0x0 && bVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::resolved(const String &path, ResolveMode mode, const Path &cwd, bool *ok)
{
    Path ret(path);
    if (ret.resolve(mode, cwd) && ok) {
        *ok = true;
    } else if (ok) {
        *ok = false;
    }
    return ret;
}